

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btVector3 *pivotInA,btVector3 *axisInA,
          bool useReferenceFrameA)

{
  undefined8 uVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  btMatrix3x3 *pbVar5;
  btTransform *this_00;
  btScalar *yy;
  btScalar *yx;
  btScalar *xz;
  btVector3 *in_RCX;
  undefined8 *in_RDX;
  btRigidBody *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  btVector3 bVar6;
  btQuaternion bVar7;
  btVector3 rbAxisB2;
  btVector3 rbAxisB1;
  btQuaternion rotationArc;
  btVector3 axisInB;
  btVector3 rbAxisA2;
  btVector3 rbAxisA1;
  btRigidBody *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  btTypedConstraint *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 uVar8;
  btMatrix3x3 *in_stack_fffffffffffffd90;
  btVector3 *in_stack_fffffffffffffd98;
  btTransform *in_stack_fffffffffffffda0;
  btScalar *in_stack_fffffffffffffda8;
  btScalar *in_stack_fffffffffffffdb0;
  btScalar *in_stack_fffffffffffffdb8;
  btVector3 *in_stack_fffffffffffffdc0;
  btVector3 *in_stack_fffffffffffffdc8;
  btVector3 *in_stack_fffffffffffffdd0;
  btScalar local_1d8;
  btScalar bStack_1d4;
  btScalar local_1b8;
  btScalar bStack_1b4;
  btScalar local_198;
  btScalar bStack_194;
  btScalar local_178;
  btScalar bStack_174;
  undefined8 *local_e0;
  undefined8 *local_c0;
  btVector3 local_a4;
  btVector3 local_94;
  btScalar local_84;
  btScalar bStack_80;
  undefined8 local_7c;
  btVector3 local_74;
  btVector3 local_64;
  btVector3 local_54 [2];
  byte local_31;
  btVector3 *local_30;
  undefined8 *local_28;
  btRigidBody *local_20;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  btTypedConstraint::btTypedConstraint
            (in_stack_fffffffffffffd80,
             (btTypedConstraintType)((ulong)in_stack_fffffffffffffd78 >> 0x20),
             in_stack_fffffffffffffd70);
  *in_RDI = &PTR__btHingeConstraint_002e72c0;
  local_c0 = in_RDI + 9;
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_fffffffffffffd70);
    local_c0 = (undefined8 *)((long)local_c0 + 0x54);
  } while (local_c0 != (undefined8 *)((long)in_RDI + 0x144));
  local_e0 = (undefined8 *)((long)in_RDI + 0x144);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_fffffffffffffd70);
    local_e0 = (undefined8 *)((long)local_e0 + 0x54);
  } while (local_e0 != in_RDI + 0x48);
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffd70);
  btTransform::btTransform((btTransform *)in_stack_fffffffffffffd70);
  btAngularLimit::btAngularLimit((btAngularLimit *)(in_RDI + 0x59));
  *(undefined1 *)(in_RDI + 0x5f) = 0;
  *(undefined1 *)((long)in_RDI + 0x2f9) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fa) = 0;
  *(undefined1 *)((long)in_RDI + 0x2fb) = 1;
  *(byte *)((long)in_RDI + 0x2fc) = local_31 & 1;
  *(undefined4 *)((long)in_RDI + 0x304) = 0;
  *(undefined4 *)(in_RDI + 0x61) = 0;
  *(undefined4 *)((long)in_RDI + 0x30c) = 0;
  *(undefined4 *)(in_RDI + 0x62) = 0;
  *(undefined4 *)((long)in_RDI + 0x314) = 0;
  btVector3::btVector3(local_54);
  btVector3::btVector3(&local_64);
  btPlaneSpace1<btVector3>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  pbVar2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x48));
  uVar1 = local_28[1];
  *(undefined8 *)pbVar2->m_floats = *local_28;
  *(undefined8 *)(pbVar2->m_floats + 2) = uVar1;
  btTransform::getBasis((btTransform *)(in_RDI + 0x48));
  btVector3::getX(local_54);
  btVector3::getX(&local_64);
  btVector3::getX(local_30);
  btVector3::getY(local_54);
  btVector3::getY(&local_64);
  pbVar3 = btVector3::getY(local_30);
  pbVar4 = btVector3::getZ(local_54);
  pbVar2 = (btVector3 *)btVector3::getZ(&local_64);
  pbVar5 = (btMatrix3x3 *)btVector3::getZ(local_30);
  btMatrix3x3::setValue
            (in_stack_fffffffffffffd90,
             (btScalar *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (btScalar *)pbVar5,(btScalar *)pbVar2,pbVar4,pbVar3,
             (btScalar *)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8,
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  this_00 = btRigidBody::getCenterOfMassTransform(local_20);
  btTransform::getBasis(this_00);
  bVar6 = ::operator*(pbVar5,pbVar2);
  local_74.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_178 = bVar6.m_floats[0];
  bStack_174 = bVar6.m_floats[1];
  local_74.m_floats[0] = local_178;
  local_74.m_floats[1] = bStack_174;
  bVar7 = shortestArcQuat(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_7c = bVar7.super_btQuadWord.m_floats._8_8_;
  local_198 = bVar7.super_btQuadWord.m_floats[0];
  bStack_194 = bVar7.super_btQuadWord.m_floats[1];
  local_84 = local_198;
  bStack_80 = bStack_194;
  bVar6 = quatRotate((btQuaternion *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_94.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_1b8 = bVar6.m_floats[0];
  bStack_1b4 = bVar6.m_floats[1];
  local_94.m_floats[0] = local_1b8;
  local_94.m_floats[1] = bStack_1b4;
  bVar6 = btVector3::cross(pbVar5->m_el,pbVar2);
  local_a4.m_floats._8_8_ = bVar6.m_floats._8_8_;
  local_1d8 = bVar6.m_floats[0];
  bStack_1d4 = bVar6.m_floats[1];
  local_a4.m_floats[0] = local_1d8;
  local_a4.m_floats[1] = bStack_1d4;
  btRigidBody::getCenterOfMassTransform(local_20);
  bVar6 = btTransform::operator()(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pbVar2 = btTransform::getOrigin((btTransform *)(in_RDI + 0x50));
  *(long *)pbVar2->m_floats = bVar6.m_floats._0_8_;
  *(long *)(pbVar2->m_floats + 2) = bVar6.m_floats._8_8_;
  btTransform::getBasis((btTransform *)(in_RDI + 0x50));
  btVector3::getX(&local_94);
  btVector3::getX(&local_a4);
  btVector3::getX(&local_74);
  pbVar3 = btVector3::getY(&local_94);
  pbVar4 = btVector3::getY(&local_a4);
  yy = btVector3::getY(&local_74);
  yx = btVector3::getZ(&local_94);
  xz = btVector3::getZ(&local_a4);
  pbVar5 = (btMatrix3x3 *)btVector3::getZ(&local_74);
  btMatrix3x3::setValue
            (pbVar5,(btScalar *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (btScalar *)pbVar5,xz,yx,yy,yx,yy,pbVar4,pbVar3);
  uVar8 = 0xbf800000;
  if ((*(byte *)((long)in_RDI + 0x2fc) & 1) == 0) {
    uVar8 = 0x3f800000;
  }
  *(undefined4 *)((long)in_RDI + 0x2f4) = uVar8;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,const btVector3& pivotInA,const btVector3& axisInA, bool useReferenceFrameA)
:btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA),
#ifdef _BT_USE_CENTER_LIMIT_
m_limit(),
#endif
m_angularOnly(false), m_enableAngularMotor(false), 
m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
m_useReferenceFrameA(useReferenceFrameA),
m_flags(0),
m_normalCFM(0),
m_normalERP(0),
m_stopCFM(0),
m_stopERP(0)
{

	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	// fixed axis in worldspace
	btVector3 rbAxisA1, rbAxisA2;
	btPlaneSpace1(axisInA, rbAxisA1, rbAxisA2);

	m_rbAFrame.getOrigin() = pivotInA;
	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btVector3 axisInB = rbA.getCenterOfMassTransform().getBasis() * axisInA;

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 = axisInB.cross(rbAxisB1);


	m_rbBFrame.getOrigin() = rbA.getCenterOfMassTransform()(pivotInA);
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}